

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Regex.cpp
# Opt level: O0

bool __thiscall Regex::processElement(Regex *this,Element *cur_node,ParseData *data)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  GroupData *pGVar4;
  GroupData *pGVar5;
  int local_3c;
  bool local_36;
  int start_pos;
  bool res;
  bool backtrack;
  Element *pEStack_30;
  int len;
  Element *child_node;
  ParseData *data_local;
  Element *cur_node_local;
  Regex *this_local;
  
  if (cur_node->mType == TYPE_OR) {
    uVar3 = JetHead::vector<Regex::GroupData>::size(&this->mGroups);
    cur_node->mGroupNum = uVar3;
    uVar3 = JetHead::vector<Regex::GroupData>::size(&this->mGroups);
    JetHead::vector<Regex::GroupData>::resize(&this->mGroups,uVar3 + 1);
    iVar1 = data->cur_pos;
    pGVar4 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,cur_node->mGroupNum);
    pGVar4->start_pos = iVar1;
    for (pEStack_30 = cur_node->mChild; pEStack_30 != (Element *)0x0; pEStack_30 = pEStack_30->mNext
        ) {
      bVar2 = processSubTree(this,pEStack_30,data);
      if (bVar2) {
        JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,cur_node->mGroupNum);
        iVar1 = data->cur_pos;
        pGVar4 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,cur_node->mGroupNum);
        pGVar4->end_pos = iVar1;
        pGVar4 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,cur_node->mGroupNum);
        pGVar5 = JetHead::vector<Regex::GroupData>::operator[](&this->mGroups,cur_node->mGroupNum);
        std::__cxx11::string::assign((string *)&pGVar4->string,(ulong)data,(long)pGVar5->start_pos);
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else if (cur_node->mType == TYPE_SEQUENCE) {
    this_local._7_1_ = true;
  }
  else {
    if ((cur_node->mType == TYPE_TERMINAL) || (cur_node->mType == TYPE_CLASS)) {
      if (cur_node->mParent->mType != TYPE_SEQUENCE) {
        __assert_fail("cur_node->mParent->mType == TYPE_SEQUENCE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Regex.cpp"
                      ,0x279,"bool Regex::processElement(Element *, ParseData *)");
      }
      local_3c = data->cur_pos;
      do {
        data->match_count = 0;
        local_36 = processTerminal(this,cur_node,data);
        while( true ) {
          if ((cur_node->mRepeatMax == -1) ||
             (bVar2 = false, data->match_count < cur_node->mRepeatMax)) {
            bVar2 = local_36 == true;
          }
          if (!bVar2) break;
          data->cur_pos = data->cur_pos + 1;
          data->match_count = data->match_count + 1;
          local_36 = processTerminal(this,cur_node,data);
        }
        bVar2 = false;
        if (local_36 == false) {
          if (cur_node->mRepeatMin <= data->match_count) {
            return true;
          }
          bVar2 = data->backtrack_pos < local_3c;
          if (bVar2) {
            local_3c = local_3c + -1;
            data->cur_pos = local_3c;
            backtrackGroups(this,data);
          }
        }
      } while (bVar2);
      if ((local_36 != false) && (cur_node->mRepeatMin <= data->match_count)) {
        data->cur_pos = data->cur_pos + 1;
        data->match_count = data->match_count + 1;
        data->backtrack_pos = data->cur_pos - (data->match_count - cur_node->mRepeatMin);
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool	Regex::processElement( Element *cur_node, ParseData *data )
{	
	if ( cur_node->mType == TYPE_OR )
	{
		cur_node->mGroupNum = mGroups.size();
		mGroups.resize( mGroups.size() + 1 );
		mGroups[ cur_node->mGroupNum ].start_pos = data->cur_pos;

		LOG_INFO( "Group %d open at %d", cur_node->mGroupNum, data->cur_pos );

		Element *child_node = cur_node->mChild;
		
		while ( child_node != NULL )
		{
			if ( processSubTree( child_node, data ) )
			{
				int len = data->cur_pos - mGroups[ cur_node->mGroupNum ].start_pos;

				mGroups[ cur_node->mGroupNum ].end_pos = data->cur_pos;
				mGroups[ cur_node->mGroupNum ].string.assign( data->string, 
					mGroups[ cur_node->mGroupNum ].start_pos, len );
		
				LOG_INFO( "Group %d closing, with size of %d and value of %s", cur_node->mGroupNum, len, mGroups[ cur_node->mGroupNum ].string.c_str() );
				LOG_INFO( "Group %d start %d, end %d", cur_node->mGroupNum, mGroups[ cur_node->mGroupNum ].start_pos, mGroups[ cur_node->mGroupNum ].end_pos );
				return true;
			}
			child_node = child_node->mNext;
		}
		
		return false;
	}
	if ( cur_node->mType == TYPE_SEQUENCE )
	{
		return true;
	}
	else if ( cur_node->mType == TYPE_TERMINAL || cur_node->mType == TYPE_CLASS )
	{
		assert( cur_node->mParent->mType == TYPE_SEQUENCE );
		
		bool backtrack = false;
		bool res;
		int start_pos = data->cur_pos;
		
		do {
			data->match_count = 0;
			res = processTerminal( cur_node, data );
		
			while ( ( cur_node->mRepeatMax == -1 || data->match_count < cur_node->mRepeatMax ) && res == true )
			{
				data->cur_pos += 1;
				data->match_count += 1;
				res = processTerminal( cur_node, data );
			}
		
			backtrack = false;
			
			if ( res == false )
			{
				if ( data->match_count >= cur_node->mRepeatMin )
					return true;
				else if ( start_pos > data->backtrack_pos )
				{
					LOG_NOTICE( "backtrack %d %d", data->cur_pos, data->backtrack_pos );
					start_pos -= 1;
					data->cur_pos = start_pos;
					backtrack = true;
					backtrackGroups( data );
				}
			}
		} while ( backtrack );

		if ( res && data->match_count >= cur_node->mRepeatMin )
		{
			data->cur_pos += 1;
			data->match_count += 1;
			data->backtrack_pos = data->cur_pos - ( data->match_count - cur_node->mRepeatMin );
			return true;
		}
	}
	
	return false;
}